

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPPolicyIteration.cpp
# Opt level: O1

QTable * __thiscall
MDPPolicyIteration::GetQTable
          (QTable *__return_storage_ptr__,MDPPolicyIteration *this,Index time_step)

{
  pointer pQVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)time_step;
  pQVar1 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pQVar1 >> 4) * -0x5555555555555555;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    QTable::QTable(__return_storage_ptr__,pQVar1 + uVar3);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

QTable MDPPolicyIteration::GetQTable(Index time_step) const
{
    return(_m_QValues.at(time_step));
}